

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_intersection.c
# Opt level: O0

_Bool array_bitset_container_intersect(array_container_t *src_1,bitset_container_t *src_2)

{
  _Bool _Var1;
  int *in_RDI;
  uint16_t key;
  int i;
  int32_t origcard;
  int iVar2;
  int iVar3;
  
  iVar3 = *in_RDI;
  iVar2 = 0;
  while( true ) {
    if (iVar3 <= iVar2) {
      return false;
    }
    _Var1 = bitset_container_contains
                      ((bitset_container_t *)CONCAT44(iVar3,iVar2),
                       *(uint16_t *)(*(long *)(in_RDI + 2) + (long)iVar2 * 2));
    if (_Var1) break;
    iVar2 = iVar2 + 1;
  }
  return true;
}

Assistant:

bool array_bitset_container_intersect(const array_container_t *src_1,
                                      const bitset_container_t *src_2) {
    const int32_t origcard = src_1->cardinality;
    for (int i = 0; i < origcard; ++i) {
        uint16_t key = src_1->array[i];
        if (bitset_container_contains(src_2, key)) return true;
    }
    return false;
}